

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propd.c
# Opt level: O1

uchar property_set(char *key,char *value)

{
  int iVar1;
  char *__dest;
  size_t __n;
  uint *puVar2;
  listnode *item;
  char acStack_1038 [4104];
  
  if ((persistent_properties_loaded == '\x01') && (iVar1 = strncmp("persist.",key,8), iVar1 == 0)) {
    snprintf(acStack_1038,0x1000,"%s/%s","/platform//property/",key);
    iVar1 = open("/platform//property//.temp",0x241,0x180);
    if (iVar1 < 0) {
      puVar2 = (uint *)__errno_location();
      log_write(3,"<3>init: Unable to write persistent property to temp file %s errno: %d\n",
                "/platform//property//.temp",(ulong)*puVar2);
    }
    else {
      __n = strlen(value);
      write(iVar1,value,__n);
      close(iVar1);
      iVar1 = rename("/platform//property//.temp",acStack_1038);
      if (iVar1 != 0) {
        unlink("/platform//property//.temp");
        log_write(3,"<3>init: Unable to rename persistent property file %s to %s\n",
                  "/platform//property//.temp",acStack_1038);
      }
    }
  }
  else if (*(int *)key == 0x2e6c7463) {
    handle_control_message(key + 4,key + 0x20);
    return '\x01';
  }
  if (key != (char *)0x0) {
    item = &prop_list;
    do {
      item = item->next;
      if (item == &prop_list) {
        __dest = (char *)malloc(0x90);
        strcpy(__dest,key);
        strcpy(__dest + 0x20,value);
        list_add_tail(&prop_list,(listnode *)(__dest + 0x80));
        return '\x01';
      }
      iVar1 = strcmp((char *)(item + -8),key);
    } while (iVar1 != 0);
    if (value == (char *)0x0) {
      list_remove(item);
      free(item + -8);
    }
    else {
      strcpy((char *)(item + -6),value);
    }
    return '\x01';
  }
  __assert_fail("key != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kiddlu[P]android-init-for-linux/init/propd.c"
                ,0x46,"unsigned char set_property(const char *, const char *)");
}

Assistant:

unsigned char property_set(const char *key, const char *value)
{
    if (persistent_properties_loaded &&
            strncmp("persist.", key, strlen("persist.")) == 0) {
        /* 
         * Don't write properties to disk until after we have read all default properties
         * to prevent them from being overwritten by default values.
         */
        write_peristent_property(key, value);
    } else if(memcmp(key,"ctl.",4) == 0) {
        handle_control_message(key+4, key + PROPERTY_KEY_MAX);
		return (1);
	} 
	
	return set_property(key, value);
}